

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLin>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ushort uVar4;
  int iVar5;
  ImU32 IVar6;
  GetterYs<unsigned_short> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  uVar4 = *(ushort *)
           ((long)pGVar7->Ys +
           (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride);
  dVar15 = log10(((double)(prim + 1) * pGVar7->XScale + pGVar7->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar12->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar5 = pTVar8->YAxis;
  fVar18 = (float)((((double)(float)(dVar15 / pIVar12->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar5].Min.x);
  fVar19 = (float)(((double)uVar4 - pIVar9->YAxis[iVar5].Range.Min) * pIVar12->My[iVar5] +
                  (double)pIVar12->PixelRange[iVar5].Min.y);
  fVar17 = (this->P1).x;
  fVar20 = (this->P1).y;
  fVar16 = fVar20;
  if (fVar19 <= fVar20) {
    fVar16 = fVar19;
  }
  bVar13 = false;
  if ((fVar16 < (cull_rect->Max).y) &&
     (fVar16 = (float)(-(uint)(fVar19 <= fVar20) & (uint)fVar20 |
                      ~-(uint)(fVar19 <= fVar20) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     bVar13 = false, *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
    fVar16 = fVar17;
    if (fVar18 <= fVar17) {
      fVar16 = fVar18;
    }
    if (fVar16 < (cull_rect->Max).x) {
      fVar16 = (float)(~-(uint)(fVar18 <= fVar17) & (uint)fVar18 |
                      -(uint)(fVar18 <= fVar17) & (uint)fVar17);
      bVar13 = (cull_rect->Min).x <= fVar16 && fVar16 != (cull_rect->Min).x;
    }
  }
  if (bVar13 != false) {
    fVar16 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar17 = fVar18 - fVar17;
    fVar20 = fVar19 - fVar20;
    fVar14 = fVar17 * fVar17 + fVar20 * fVar20;
    if (0.0 < fVar14) {
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar17 = fVar17 * (1.0 / fVar14);
      fVar20 = fVar20 * (1.0 / fVar14);
    }
    fVar16 = fVar16 * 0.5;
    fVar17 = fVar17 * fVar16;
    fVar16 = fVar16 * fVar20;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = (this->P1).x + fVar16;
    (pIVar10->pos).y = (this->P1).y - fVar17;
    pIVar10->uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar16 + fVar18;
    pIVar10[1].pos.y = fVar19 - fVar17;
    pIVar10[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar18 - fVar16;
    pIVar10[2].pos.y = fVar17 + fVar19;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = (this->P1).x - fVar16;
    pIVar10[3].pos.y = fVar17 + (this->P1).y;
    pIVar10[3].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar3.y = fVar19;
  IVar3.x = fVar18;
  this->P1 = IVar3;
  return bVar13;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }